

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp3::sPolynomial13
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0xbd];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x76] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xcc] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0xcd];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x94] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0xdc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xa3] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0xeb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xb2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xdb] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xc1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xea] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xfa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xd0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xee] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0x109] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xfd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x108] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial13( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(13,7) = groebnerMatrix(9,13)/(groebnerMatrix(9,12));
  groebnerMatrix(13,9) = -groebnerMatrix(10,14)/(groebnerMatrix(10,13));
  groebnerMatrix(13,10) = -groebnerMatrix(10,15)/(groebnerMatrix(10,13));
  groebnerMatrix(13,11) = groebnerMatrix(9,14)/(groebnerMatrix(9,12));
  groebnerMatrix(13,12) = (groebnerMatrix(9,15)/(groebnerMatrix(9,12))-groebnerMatrix(10,16)/(groebnerMatrix(10,13)));
  groebnerMatrix(13,13) = groebnerMatrix(9,16)/(groebnerMatrix(9,12));
  groebnerMatrix(13,15) = -groebnerMatrix(10,17)/(groebnerMatrix(10,13));
  groebnerMatrix(13,16) = groebnerMatrix(9,17)/(groebnerMatrix(9,12));
}